

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_unix_connect(msocket_t *self,char *socketPath)

{
  int8_t iVar1;
  int iVar2;
  int *piVar3;
  int result;
  char *socketPath_local;
  msocket_t *self_local;
  
  if ((self == (msocket_t *)0x0) || ((self->socketMode & 2) != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    self_local._7_1_ = -1;
  }
  else if (self->handlerTable == (msocket_handler_t *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0xe;
    self_local._7_1_ = -1;
  }
  else {
    iVar2 = msocket_connect_unix_internal(self,socketPath);
    if (iVar2 < 0) {
      self_local._7_1_ = -1;
    }
    else {
      self->socketMode = self->socketMode | 2;
      self->state = '\x04';
      self->newConnection = '\x01';
      iVar1 = msocket_startIoThread(self);
      if (iVar1 < '\0') {
        close(self->tcpsockfd);
        self->state = '\x06';
        self_local._7_1_ = -1;
      }
      else {
        self_local._7_1_ = '\0';
      }
    }
  }
  return self_local._7_1_;
}

Assistant:

int8_t msocket_unix_connect(msocket_t *self, const char *socketPath)
{
   if( (self != 0) && ( (self->socketMode & MSOCKET_MODE_TCP) == 0) ){
      int result;
      if (self->handlerTable == 0) {
         errno = EFAULT;
         return -1;
      }
#ifndef _WIN32
      result = msocket_connect_unix_internal(self, socketPath);
      if (result < 0) {
         //errno alredy set by system call
         return -1;
      }

      self->socketMode |= MSOCKET_MODE_TCP; //Treat connection the same way as if it was set to TCP
      self->state = MSOCKET_STATE_ESTABLISHED;
      self->newConnection = 1;
      result = msocket_startIoThread(self);
      if (result < 0) {
         SOCKET_CLOSE(self->tcpsockfd);
         self->state = MSOCKET_STATE_CLOSED;
         return -1;
      }
      return 0;
#else
      (void)socketPath;
      errno = EAFNOSUPPORT; //UNIX domain socket not supported in Windows
      result = -1;
#endif // !_WIN32
   }
   errno = EINVAL;
   return -1;
}